

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void __thiscall
module_reverse_csv_actions::from_header(module_reverse_csv_actions *this,string *header)

{
  char local_9;
  
  if (this->first_header_ == true) {
    this->first_header_ = false;
  }
  else {
    local_9 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_9,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(header->_M_dataplus)._M_p,header->_M_string_length);
  return;
}

Assistant:

void from_header( std::string const & header )
    {
        if( first_header_ )
            first_header_ = false;
        else
            std::cout << ' ';
        std::cout << header;
    }